

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte *pbVar1;
  u8 uVar2;
  byte bVar3;
  Fts3Phrase *pFVar4;
  sqlite3_vtab *psVar5;
  Fts3Phrase *pFVar6;
  char *pBuf;
  bool bVar7;
  int iVar8;
  uint uVar9;
  char *pEnd;
  byte *pbVar10;
  Fts3Expr *pFVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  undefined1 *puVar16;
  bool bVar17;
  bool bVar18;
  long in_FS_OFFSET;
  u8 bEof;
  int rc;
  sqlite3_int64 iDocid;
  int iThis;
  int dummy;
  u8 local_5d;
  uint local_5c;
  undefined1 *local_58;
  int local_4c;
  byte *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar4 = pExpr->pPhrase;
  psVar5 = (pCsr->base).pVtab;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_4c = -0x55555556;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  *ppOut = (char *)0x0;
  if ((pFVar4->iColumn == iCol) || (*(int *)&psVar5[2].pModule <= pFVar4->iColumn)) {
    local_58 = (undefined1 *)pExpr->iDocid;
    local_48 = (byte *)(pFVar4->doclist).pList;
    if ((local_58 != (undefined1 *)pCsr->iPrevId) || (pExpr->bEof != '\0')) {
      local_5c = 0;
      pFVar11 = pExpr->pParent;
      bVar17 = false;
      if (pFVar11 == (Fts3Expr *)0x0) {
        bVar18 = true;
      }
      else {
        bVar18 = bVar17;
        bVar17 = false;
        do {
          if (pFVar11->eType == 4) {
            bVar18 = true;
          }
          if (pFVar11->eType == 1) {
            pExpr = pFVar11;
          }
          if (pFVar11->bEof != '\0') {
            bVar17 = true;
          }
          pFVar11 = pFVar11->pParent;
        } while (pFVar11 != (Fts3Expr *)0x0);
        bVar18 = !bVar18;
      }
      bVar7 = false;
      pbVar10 = (byte *)0x0;
      if (!bVar18) {
        uVar2 = pExpr->bDeferred;
        pFVar11 = pExpr;
        while (uVar2 != '\0') {
          pFVar11 = pFVar11->pParent;
          uVar2 = pFVar11->bDeferred;
        }
        bVar3 = *(byte *)((long)&psVar5[0x13].pModule + 7);
        if (pFVar4->bIncr != 0) {
          uVar2 = pFVar11->bEof;
          fts3EvalRestart(pCsr,pFVar11,(int *)&local_5c);
          if (local_5c == 0) {
            while (pFVar11->bEof == '\0') {
              fts3EvalNextRow(pCsr,pFVar11,(int *)&local_5c);
              if (((uVar2 == '\0') && ((undefined1 *)pFVar11->iDocid == local_58)) ||
                 (local_5c != 0)) break;
            }
          }
          if ((local_5c == 0) && (pFVar11->bEof != uVar2)) {
            local_5c = 0x10b;
          }
        }
        if ((bool)(bVar17 & local_5c == 0)) {
          do {
            if (pFVar11->bEof != '\0') break;
            fts3EvalNextRow(pCsr,pFVar11,(int *)&local_5c);
          } while (local_5c == 0);
        }
        pbVar10 = (byte *)(ulong)local_5c;
        if (local_5c == 0) {
          if (pExpr != (Fts3Expr *)0x0) {
            bVar17 = true;
LAB_001d7f1c:
            pFVar11 = pExpr;
            if (pExpr->eType == 1) {
              pFVar11 = pExpr->pRight;
            }
            pFVar6 = pFVar11->pPhrase;
            local_48 = (byte *)pFVar6->pOrPoslist;
            local_58 = (undefined1 *)pFVar6->iOrDocid;
            iVar8 = (pFVar6->doclist).nAll;
            if (pCsr->bDesc != bVar3) {
              if (iVar8 == 0) {
                local_5d = '\x01';
              }
              else if (local_48 == (byte *)0x0) {
                local_5d = '\0';
              }
              else {
                local_5d = local_48 <= (pFVar6->doclist).aAll;
              }
              do {
                if (local_48 != (byte *)0x0) {
                  bVar18 = (long)local_58 < pCsr->iPrevId;
                  if (bVar3 == 0) {
                    bVar18 = pCsr->iPrevId < (long)local_58;
                  }
                  if (!bVar18) goto LAB_001d80c9;
                }
                if (local_5d != '\0') goto LAB_001d80c9;
                local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
                sqlite3Fts3DoclistPrev
                          ((uint)bVar3,(pFVar6->doclist).aAll,(pFVar6->doclist).nAll,
                           (char **)&local_48,(sqlite3_int64 *)&local_58,(int *)&local_40,&local_5d)
                ;
              } while( true );
            }
            if (iVar8 == 0) {
              local_5d = '\x01';
            }
            else {
              local_5d = (pFVar6->doclist).aAll + iVar8 <= local_48;
            }
LAB_001d7f81:
            if (local_48 != (byte *)0x0) {
              iVar8 = -(uint)(local_58 != (undefined1 *)pCsr->iPrevId);
              if ((long)pCsr->iPrevId < (long)local_58) {
                iVar8 = 1;
              }
              iVar15 = -iVar8;
              if (bVar3 == 0) {
                iVar15 = iVar8;
              }
              if (-1 < iVar15) goto LAB_001d80c9;
            }
            if (local_5d != '\0') goto LAB_001d80c9;
            pBuf = (pFVar6->doclist).aAll;
            if (local_48 == (byte *)0x0) {
              iVar8 = sqlite3Fts3GetVarintU(pBuf,(sqlite_uint64 *)&local_58);
              local_48 = (byte *)(pBuf + iVar8);
            }
            else {
              pbVar10 = local_48;
              bVar13 = *local_48;
              if (*local_48 != 0) {
                do {
                  pbVar1 = pbVar10 + 1;
                  pbVar10 = pbVar10 + 1;
                  bVar14 = bVar13 & 0x80;
                  bVar13 = *pbVar1;
                } while (bVar14 != 0 || *pbVar1 != 0);
              }
              do {
                pbVar1 = pbVar10 + 1;
                if (pBuf + (pFVar6->doclist).nAll <= pbVar1) {
                  local_5d = '\x01';
                  local_48 = pbVar10 + 1;
                  goto LAB_001d7f81;
                }
                pbVar10 = pbVar1;
              } while (*pbVar1 == 0);
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              iVar8 = sqlite3Fts3GetVarintU((char *)pbVar1,(sqlite_uint64 *)&local_40);
              local_48 = pbVar1 + iVar8;
              puVar16 = (undefined1 *)-(long)local_40;
              if (bVar3 == 0) {
                puVar16 = local_40;
              }
              local_58 = local_58 + (long)puVar16;
            }
            goto LAB_001d7f81;
          }
          goto LAB_001d8104;
        }
        bVar7 = false;
      }
      goto LAB_001d811d;
    }
    goto LAB_001d8125;
  }
LAB_001d7da1:
  iVar8 = 0;
LAB_001d8216:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
LAB_001d80c9:
  pFVar6->pOrPoslist = (char *)local_48;
  pFVar6->iOrDocid = (i64)local_58;
  if ((local_5d != '\0') || (local_58 != (undefined1 *)pCsr->iPrevId)) {
    bVar17 = false;
  }
  pExpr = pExpr->pLeft;
  if (pExpr == (Fts3Expr *)0x0) goto code_r0x001d80fd;
  goto LAB_001d7f1c;
code_r0x001d80fd:
  if (bVar17) {
LAB_001d8104:
    pbVar10 = (byte *)pFVar4->pOrPoslist;
  }
  else {
    pbVar10 = (byte *)0x0;
  }
  bVar7 = true;
  local_48 = pbVar10;
LAB_001d811d:
  iVar8 = (int)pbVar10;
  if (!bVar7) goto LAB_001d8216;
LAB_001d8125:
  if (local_48 != (byte *)0x0) {
    if (*local_48 == 1) {
      pbVar10 = local_48 + 1;
      if ((char)local_48[1] < '\0') {
        local_48 = pbVar10;
        uVar9 = sqlite3Fts3GetVarint32((char *)pbVar10,&local_4c);
        uVar12 = (ulong)uVar9;
      }
      else {
        uVar12 = 1;
        local_4c = (int)(char)local_48[1];
      }
      local_48 = pbVar10 + uVar12;
    }
    else {
      local_4c = 0;
    }
    if (local_4c < iCol) {
      do {
        bVar3 = *local_48;
        if (1 < bVar3) {
          do {
            bVar13 = bVar3 & 0x80;
            bVar3 = local_48[1];
            local_48 = local_48 + 1;
          } while ((bVar3 & 0xfe) != 0 || bVar13 != 0);
        }
        if (*local_48 == 0) goto LAB_001d7da1;
        pbVar10 = local_48 + 1;
        if ((char)local_48[1] < '\0') {
          local_48 = pbVar10;
          uVar9 = sqlite3Fts3GetVarint32((char *)pbVar10,&local_4c);
          uVar12 = (ulong)uVar9;
        }
        else {
          uVar12 = 1;
          local_4c = (int)(char)local_48[1];
        }
        local_48 = pbVar10 + uVar12;
      } while (local_4c < iCol);
    }
    iVar8 = 0;
    if (*local_48 == 0) {
      local_48 = (byte *)0x0;
    }
    pbVar10 = local_48;
    if (local_4c != iCol) {
      pbVar10 = (byte *)0x0;
    }
    *ppOut = (char *)pbVar10;
    goto LAB_001d8216;
  }
  goto LAB_001d7da1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    Fts3Expr *pRun;               /* Closest non-deferred ancestor of pNear */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not,
    ** return NULL. Otherwise, the entry that corresponds to docid
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;
    pRun = pNear;
    while( pRun->bDeferred ){
      assert( pRun->pParent );
      pRun = pRun->pParent;
    }

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pRun->bEof;
      fts3EvalRestart(pCsr, pRun, &rc);
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
        if( bEofSave==0 && pRun->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
      if( rc==SQLITE_OK && pRun->bEof!=bEofSave ){
        rc = FTS_CORRUPT_VTAB;
      }
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}